

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache_ptr.cc
# Opt level: O0

ThreadCache * tcmalloc::SlowTLS::TryToReleaseCacheFromAllocation(Result *result)

{
  Entry *entry_00;
  bool bVar1;
  ThreadCache *cache;
  Entry *entry;
  Result *result_local;
  
  entry_00 = result->entry_;
  if (((entry_00->was_allocated & 1U) == 0) ||
     (bVar1 = ThreadCachePtr::ThreadCacheKeyIsReady(), !bVar1)) {
    result_local = (Result *)0x0;
  }
  else {
    result_local = (Result *)entry_00->cache;
    UnregisterEntry(entry_00);
  }
  return (ThreadCache *)result_local;
}

Assistant:

static ThreadCache* TryToReleaseCacheFromAllocation(Result* result) {
    Entry* entry = result->entry_;

    // GetSlow deals with emergency_malloc case before it calling us.
    ASSERT(!entry->emergency_malloc);

    if (PREDICT_FALSE(entry->was_allocated) && ThreadCachePtr::ThreadCacheKeyIsReady()) {
      ThreadCache* cache = entry->cache;

      SlowTLS::UnregisterEntry(entry);

      return cache;
    }

    return nullptr;
  }